

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexExecImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool isSticky_00;
  bool bVar4;
  uint16 uVar5;
  RegexPattern *this;
  JavascriptLibrary *pJVar6;
  char16 *input_00;
  Var nonMatchValue_00;
  SparseArraySegmentBase *pSVar7;
  SparseArraySegmentBase *pSVar8;
  undefined4 *puVar9;
  Var ptr;
  uint local_a4;
  uint groupId;
  Type *elements;
  Var nonMatchValue;
  JavascriptArray *result;
  int numGroups;
  char16 *inputStr;
  GroupInfo match;
  CharCount inputLength;
  CharCount offset;
  bool isSticky;
  bool isGlobal;
  RegexPattern *pattern;
  void *stackAllocationPointer_local;
  bool noResult_local;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  this = JavascriptRegExp::GetPattern(regularExpression);
  RegexHelperTrace(scriptContext,Exec,regularExpression,input);
  bVar3 = UnifiedRegex::RegexPattern::IsGlobal(this);
  isSticky_00 = UnifiedRegex::RegexPattern::IsSticky(this);
  match.offset = JavascriptString::GetLength(input);
  bVar4 = GetInitialOffset(bVar3,isSticky_00,regularExpression,match.offset,&match.length);
  if (bVar4) {
    UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)((long)&inputStr + 4));
    if (match.length <= match.offset) {
      input_00 = JavascriptString::GetString(input);
      register0x00000000 = SimpleMatch(scriptContext,this,input_00,match.offset,match.length);
    }
    PropagateLastMatch(scriptContext,bVar3,isSticky_00,regularExpression,input,
                       stack0xffffffffffffffac,stack0xffffffffffffffac,true,true,false);
    if ((noResult) ||
       (bVar3 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)((long)&inputStr + 4)), bVar3)) {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      scriptContext_local =
           (ScriptContext *)JavascriptLibraryBase::GetNull(&pJVar6->super_JavascriptLibraryBase);
    }
    else {
      uVar5 = UnifiedRegex::RegexPattern::NumGroups(this);
      scriptContext_local =
           (ScriptContext *)
           CreateExecResult(stackAllocationPointer,scriptContext,(uint)uVar5,input,
                            stack0xffffffffffffffac);
      nonMatchValue_00 = NonMatchValue(scriptContext,false);
      pSVar7 = Js::JavascriptArray::GetHead((JavascriptArray *)scriptContext_local);
      for (local_a4 = 0; local_a4 < uVar5; local_a4 = local_a4 + 1) {
        pSVar8 = Js::JavascriptArray::GetHead((JavascriptArray *)scriptContext_local);
        TVar1 = pSVar8->left;
        pSVar8 = Js::JavascriptArray::GetHead((JavascriptArray *)scriptContext_local);
        if (TVar1 + pSVar8->length <= local_a4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x281,
                                      "(groupId < result->GetHead()->left + result->GetHead()->length)"
                                      ,
                                      "groupId < result->GetHead()->left + result->GetHead()->length"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        ptr = GetGroup(scriptContext,this,input,nonMatchValue_00,local_a4);
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)(&pSVar7[1].left + (ulong)local_a4 * 2),ptr);
      }
    }
  }
  else {
    pJVar6 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)JavascriptLibraryBase::GetNull(&pJVar6->super_JavascriptLibraryBase);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexExecImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Exec, regularExpression, input);
#endif

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        CharCount offset;
        CharCount inputLength = input->GetLength();
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        UnifiedRegex::GroupInfo match; // initially undefined
        if (offset <= inputLength)
        {
            const char16* inputStr = input->GetString();
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);

        if (noResult || match.IsUndefined())
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        Assert(numGroups >= 0);
        JavascriptArray* result = CreateExecResult(stackAllocationPointer, scriptContext, numGroups, input, match);
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        Field(Var) *elements = ((SparseArraySegment<Var>*)result->GetHead())->elements;
        for (uint groupId = 0; groupId < (uint)numGroups; groupId++)
        {
            Assert(groupId < result->GetHead()->left + result->GetHead()->length);
            elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
        }
        return result;
    }